

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O2

double __thiscall
Js::DateImplementation::SetDateData
          (DateImplementation *this,Arguments *args,DateData dd,bool fUtc,
          ScriptContext *scriptContext)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  Var aValue;
  DateImplementation *pDVar5;
  undefined4 *puVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  double dVar10;
  Type tv;
  YMD emptyYMD;
  double local_88;
  double rgdbl [5];
  
  if (9 < dd._value) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x687,"(false)","DateData type invalid");
    if (bVar3) {
      *puVar6 = 0;
      JavascriptError::ThrowError(scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
    }
LAB_00a19c83:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  uVar1 = *(uint *)(mpddcvar + (ulong)dd._value * 4);
  lVar7 = 0;
  for (uVar9 = 0;
      (uVar8 = (uint)uVar9, uVar9 < (*(uint *)&args->Info & 0xffffff) - 1 && (uVar9 < uVar1));
      uVar9 = uVar9 + 1) {
    aValue = Arguments::operator[](args,uVar8 + 1);
    dVar10 = JavascriptConversion::ToNumber(aValue,scriptContext);
    bVar3 = NumberUtilities::IsFinite(dVar10);
    if (!bVar3) goto LAB_00a1996c;
    dVar10 = ConvertToInteger(dVar10);
    rgdbl[uVar9 - 1] = dVar10;
    lVar7 = lVar7 + -8;
  }
  if (lVar7 == 0) {
LAB_00a1996c:
    this->m_grfval = 0;
    dVar10 = NAN;
    this->m_tvUtc = NAN;
    this->field_0x58 = this->field_0x58 | 1;
  }
  else {
    BVar4 = JavascriptNumber::IsNan(this->m_tvUtc);
    if (BVar4 == 0) {
      if (fUtc) {
        EnsureYmdUtc(this);
        pDVar5 = this;
      }
      else {
        EnsureYmdLcl<Js::ScriptContext>(this,scriptContext);
        pDVar5 = (DateImplementation *)&this->m_tvLcl;
      }
      tv = pDVar5->m_tvUtc;
      if (dd._value < 8) {
        dVar10 = (double)(*(code *)(&DAT_00f6c7fc + *(int *)(&DAT_00f6c7fc + (ulong)dd._value * 4)))
                                   (0x3c);
        return dVar10;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                  ,0x6fa,"(false)","DataData type invalid");
      if (!bVar3) goto LAB_00a19c83;
      *puVar6 = 0;
    }
    else {
      if (dd._value == '\0') {
        if ((local_88 < 100.0) && (0.0 <= local_88)) {
          local_88 = local_88 + 1900.0;
        }
      }
      else if (dd._value != '\x01') goto LAB_00a1996c;
      if ((uVar8 < 3) && (rgdbl[1] = 1.0, uVar8 != 2)) {
        rgdbl[0] = 0.0;
      }
      tv = DateUtilities::TvFromDate(local_88,rgdbl[0],rgdbl[1] + -1.0,0.0);
    }
    if (fUtc) {
      SetTvUtc(this,tv);
    }
    else {
      SetTvLcl(this,tv,scriptContext);
    }
    this->field_0x58 = this->field_0x58 | 1;
    dVar10 = this->m_tvUtc;
  }
  return dVar10;
}

Assistant:

double DateImplementation::SetDateData(Arguments args, DateData dd, bool fUtc, ScriptContext* scriptContext)
    {
        // This must accommodate the largest cvar in mpddcvar.
        double rgdbl[5];

        double tv = 0;
        DateTime::YMD *pymd = NULL;
        DateTime::YMD emptyYMD = {0};
        uint count = 0;

        uint cvarMax;
        uint ivar;

        // PREFAST: check limits
        if (dd < 0 || dd >= DateData::Lim)
        {
            AssertMsg(false, "DateData type invalid");
            Js::JavascriptError::ThrowError(scriptContext, VBSERR_InternalError);
        }

        // Get the parameters.
        cvarMax = mpddcvar[dd];

        __analysis_assume(cvarMax <= 4);

        //
        // arg[0] would be the date object itself
        //
        for (ivar = 0; (ivar < (args.Info.Count-1)) && ivar < cvarMax; ++ivar)
        {
            rgdbl[ivar] = JavascriptConversion::ToNumber(args[ivar+1],scriptContext);

            if (!Js::NumberUtilities::IsFinite(rgdbl[ivar]))
                goto LSetNan;

            rgdbl[ivar] = ConvertToInteger(rgdbl[ivar]);
        }

        if ((count = ivar) < 1)
        {
            goto LSetNan;
        }

        if (JavascriptNumber::IsNan(m_tvUtc))
        {


            // If the current time is not finite, the only way we can end up
            // with non-NaN is for setFullYear/setYear.
            // See ES5 15.9.5.40, ES5 B.2.5.
            if (!(DateData::FullYear == dd || DateData::Year == dd))
            {
                goto LSetNan;
            }
            pymd = &emptyYMD;           // We need mon, mday, time to be 0.
            // Fall through to DateData::Year and DataData::FullYear cases below.
        }
        else
        {
            if (fUtc)
            {
                EnsureYmdUtc();
                pymd = &m_ymdUtc;
                tv = m_tvUtc;
            }
            else
            {
                EnsureYmdLcl(scriptContext);
                pymd = &m_ymdLcl;
                tv = m_tvLcl;
            }
        }

        ivar = 0;
        switch (dd)
        {
        case DateData::Year:
            if (rgdbl[0] < 100 && rgdbl[0] >= 0)
                rgdbl[0] += 1900;
            // fall-through
        case DateData::FullYear:
    LFullYear:
            if (count < 3)
            {
                // Only {year} or {year, month} is specified. Day is not specified.
                rgdbl[2] = pymd->mday + 1;
                if (count < 2)
                {
                    // Month is not specified.
                    rgdbl[1] = pymd->mon;
                }
            }
            tv = TvFromDate(rgdbl[0], rgdbl[1], rgdbl[2] - 1, pymd->time);
            break;
        case DateData::Month:
            memmove(rgdbl + 1, rgdbl, count * sizeof(double));
            count++;
            rgdbl[0] = pymd->year;
            goto LFullYear;
        case DateData::Date:
            tv += (rgdbl[ivar] - pymd->mday - 1) * 86400000;
            if (++ivar >= count)
            {
                break;
            }
            // fall-through
        case DateData::Hours:
            tv += (rgdbl[ivar] - (pymd->time / 3600000)) * 3600000;
            if (++ivar >= count)
            {
                break;
            }
            // fall-through
        case DateData::Minutes:
            tv += (rgdbl[ivar] - (pymd->time / 60000) % 60) * 60000;
            if (++ivar >= count)
            {
                break;
            }
            // fall-through
        case DateData::Seconds:
            tv += (rgdbl[ivar] - (pymd->time / 1000) % 60) * 1000;
            if (++ivar >= count)
            {
                break;
            }
            // fall-through
        case DateData::Milliseconds:
            tv += rgdbl[ivar] - pymd->time % 1000;
            break;
        default:
            AssertMsg(false, "DataData type invalid");
        }

        if (fUtc)
        {
            SetTvUtc(tv);
        }
        else
        {
            SetTvLcl(tv, scriptContext);
        }

        m_modified = true;
        return m_tvUtc;

    LSetNan:
        m_grfval = 0;
        m_tvUtc = JavascriptNumber::NaN;
        m_modified = true;

        return m_tvUtc;
    }